

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.hpp
# Opt level: O0

void __thiscall burst::dynamic_tuple::pop_back(dynamic_tuple *this)

{
  size_t sVar1;
  bool bVar2;
  reference pvVar3;
  int8_t *data;
  size_t sVar4;
  size_t size;
  size_t offset;
  dynamic_tuple *this_local;
  
  pvVar3 = std::
           vector<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>
           ::back(&this->m_objects);
  data = dynamic_tuple::data(this);
  management::destroy(pvVar3,data);
  std::vector<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>::
  pop_back(&this->m_objects);
  bVar2 = std::
          vector<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>
          ::empty(&this->m_objects);
  if (bVar2) {
    this->m_volume = 0;
  }
  else {
    pvVar3 = std::
             vector<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>
             ::back(&this->m_objects);
    sVar1 = pvVar3->offset;
    pvVar3 = std::
             vector<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>
             ::back(&this->m_objects);
    sVar4 = management::size_of(pvVar3);
    this->m_volume = sVar1 + sVar4;
  }
  return;
}

Assistant:

void pop_back ()
        {
            management::destroy(m_objects.back(), data());
            m_objects.pop_back();

            if (not m_objects.empty())
            {
                auto offset = m_objects.back().offset;
                auto size = management::size_of(m_objects.back());

                m_volume = offset + size;
            }
            else
            {
                m_volume = 0;
            }
        }